

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void __thiscall deqp::gls::ub::UniformBlock::UniformBlock(UniformBlock *this,char *blockName)

{
  allocator<char> local_19;
  char *local_18;
  char *blockName_local;
  UniformBlock *this_local;
  
  local_18 = blockName;
  blockName_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,blockName,&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::__cxx11::string::string((string *)&this->m_instanceName);
  std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::vector
            (&this->m_uniforms);
  this->m_arraySize = 0;
  this->m_flags = 0;
  return;
}

Assistant:

UniformBlock::UniformBlock (const char* blockName)
	: m_blockName	(blockName)
	, m_arraySize	(0)
	, m_flags		(0)
{
}